

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O2

void __thiscall glauber::NucleonProfile::fluctuate(NucleonProfile *this,Nucleon *nucleon)

{
  result_type_conflict rVar1;
  undefined1 auVar2 [16];
  undefined8 in_XMM2_Qa;
  undefined1 auVar3 [16];
  
  rVar1 = std::gamma_distribution<double>::operator()
                    (&this->fluct_dist_,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)random::engine);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->alpha_;
  auVar3._0_8_ = (double)(nucleon->ncoll_ + -1);
  auVar3._8_8_ = in_XMM2_Qa;
  auVar2 = vfmadd213sd_fma(auVar3,auVar2,ZEXT816(0x3ff0000000000000));
  this->prefactor_ = ((rVar1 * 0.15915494309189535) / this->width_sqr_) * auVar2._0_8_;
  return;
}

Assistant:

inline void NucleonProfile::fluctuate(const Nucleon& nucleon) {
  prefactor_ = fluct_dist_(random::engine) *
     math::double_constants::one_div_two_pi / width_sqr_ *
     (1 + alpha_*(nucleon.ncoll() - 1));
}